

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::api::anon_unknown_1::DescriptorSetLayout::create
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  ulong uVar1;
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  VkDescriptorSetLayoutCreateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28.flags = 0;
  local_28.pBindings =
       (res->bindings).
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(res->bindings).
                super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_28.pBindings;
  if (uVar1 == 0) {
    local_28.pBindings = (pointer)0x0;
  }
  local_28.bindingCount = (int)(uVar1 >> 3) * -0x55555555;
  ::vk::createDescriptorSetLayout
            (__return_storage_ptr__,env->vkd,env->device,&local_28,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorSetLayout> create (const Environment& env, const Resources& res, const Parameters&)
	{
		const VkDescriptorSetLayoutCreateInfo	descriptorSetLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0,
			(deUint32)res.bindings.size(),
			(res.bindings.empty() ? DE_NULL : &res.bindings[0])
		};

		return createDescriptorSetLayout(env.vkd, env.device, &descriptorSetLayoutInfo, env.allocationCallbacks);
	}